

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

char * __thiscall sznet::net::TcpConnection::stateToString(TcpConnection *this)

{
  TcpConnection *this_local;
  
  switch(this->m_state) {
  case kDisconnected:
    this_local = (TcpConnection *)0x1ae90c;
    break;
  case kConnecting:
    this_local = (TcpConnection *)0x1aec59;
    break;
  case kConnected:
    this_local = (TcpConnection *)0x1aeae7;
    break;
  case kDisconnecting:
    this_local = (TcpConnection *)0x1b0ef1;
    break;
  default:
    this_local = (TcpConnection *)anon_var_dwarf_32bfd;
  }
  return (char *)this_local;
}

Assistant:

const char* TcpConnection::stateToString() const
{
	switch (m_state)
	{
	case kDisconnected:
		return "kDisconnected";
	case kConnecting:
		return "kConnecting";
	case kConnected:
		return "kConnected";
	case kDisconnecting:
		return "kDisconnecting";
	default:
		return "unknown state";
	}
}